

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpMessage<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  ushort uVar2;
  uint32_t uVar3;
  byte *pbVar4;
  bool bVar5;
  ushort uVar6;
  char *pcVar7;
  MessageLite *pMVar8;
  TcParseTableBase *table_00;
  string *psVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Arena *arena;
  char *pcVar13;
  FieldEntry *pFVar14;
  long *plVar15;
  int iVar16;
  int iVar17;
  FieldEntry *entry;
  long lVar18;
  pair<const_char_*,_int> pVar19;
  int local_40;
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  pFVar14 = entry;
  if (((ulong)entry & 3) != 0) {
LAB_001592db:
    AlignFail(pFVar14);
  }
  uVar2 = entry->type_card;
  uVar6 = uVar2 & 0x30;
  if (uVar6 == 0x20) {
    if ((uVar2 & 0x1c0) == 0x40) {
      pcVar7 = MpRepeatedMessageOrGroup<false,true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar7;
    }
    if ((uVar2 & 0x1c0) == 0) {
      pcVar7 = MpRepeatedMessageOrGroup<false,false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar7;
    }
LAB_001590a2:
    pcVar7 = (*table->fallback)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar7;
  }
  uVar10 = data.field_0._0_4_ & 7;
  if ((uVar2 & 0x1c0) == 0x40) {
    if (uVar10 != 3) goto LAB_001590a2;
  }
  else if (((uVar2 & 0x1c0) != 0) || (uVar10 != 2)) goto LAB_001590a2;
  if (uVar6 == 0x30) {
    bVar5 = ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,
                        (ParseContext *)(ulong)uVar10,msg);
  }
  else {
    if (uVar6 == 0x10) {
      pbVar4 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
      *pbVar4 = *pbVar4 | '\x01' << (entry->has_idx & 7U);
    }
    bVar5 = false;
  }
  if ((ulong)table->has_bits_offset != 0) {
    pFVar14 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)pFVar14 & 3) != 0) goto LAB_001592db;
    pFVar14->offset = pFVar14->offset | (uint)hasbits;
  }
  plVar15 = (long *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
  if (((ulong)plVar15 & 7) != 0) {
    AlignFail(plVar15);
  }
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset + (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  uVar10 = uVar2 >> 9 & 3;
  if ((short)uVar10 != 2) {
    if ((uVar2 >> 9 & 3) == 0) {
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      pcVar7 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
      uVar11 = 0x40;
      uVar12 = 0x902;
      goto LAB_0015934f;
    }
    if (uVar10 != 1) {
      table_00 = *(TcParseTableBase **)table_00;
    }
    table_00 = MessageLite::GetTcParseTable((MessageLite *)table_00);
  }
  pcVar7 = (char *)(ulong)uVar10;
  if ((bVar5 | *plVar15 == 0) == 1) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar8 = ClassData::New(table_00->class_data,arena);
    *plVar15 = (long)pMVar8;
    pcVar7 = ptr;
  }
  iVar17 = (int)pcVar7;
  if ((uVar2 & 0x1c0) == 0x40) {
    iVar17 = ctx->depth_;
    lVar1 = (long)iVar17 + -1;
    iVar16 = (int)lVar1;
    ctx->depth_ = iVar16;
    if (0 < (long)iVar17) {
      lVar18 = (long)ctx->group_depth_ + 1;
      iVar17 = (int)lVar18;
      ctx->group_depth_ = iVar17;
      pcVar7 = ParseLoopPreserveNone((MessageLite *)*plVar15,ptr,ctx,table_00);
      if (pcVar7 == (char *)0x0) {
LAB_001591f4:
        ctx->group_depth_ = ctx->group_depth_ + -1;
        ctx->depth_ = ctx->depth_ + 1;
        uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar3 != data.field_0._0_4_) {
          return (char *)0x0;
        }
        return pcVar7;
      }
      if (iVar16 == ctx->depth_) {
        psVar9 = (string *)0x0;
      }
      else {
        psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar1,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar9 == (string *)0x0) {
        if (iVar17 == ctx->group_depth_) {
          psVar9 = (string *)0x0;
        }
        else {
          psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar18,(long)ctx->group_depth_,"old_group_depth == group_depth_");
        }
        if (psVar9 == (string *)0x0) goto LAB_001591f4;
        pcVar7 = *(char **)psVar9;
        uVar11 = *(undefined8 *)(psVar9 + 8);
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
        ;
        uVar12 = 0x45c;
      }
      else {
        pcVar7 = *(char **)psVar9;
        uVar11 = *(undefined8 *)(psVar9 + 8);
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
        ;
        uVar12 = 0x45b;
      }
LAB_0015934f:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0,pcVar13,uVar12,uVar11,pcVar7);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffffc0);
    }
  }
  else {
    if (*ptr < '\0') {
      pVar19 = ReadSizeFallback(ptr,(uint)(byte)*ptr);
      pcVar7 = pVar19.first;
    }
    else {
      pcVar7 = ptr + 1;
    }
    if ((pcVar7 == (char *)0x0) || (ctx->depth_ < 1)) {
      pcVar7 = (char *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit
                ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)pcVar7);
      ctx->depth_ = ctx->depth_ + -1;
      iVar17 = local_40;
    }
    if (pcVar7 != (char *)0x0) {
      iVar16 = ctx->depth_;
      pcVar7 = ParseLoopPreserveNone((MessageLite *)*plVar15,pcVar7,ctx,table_00);
      if (pcVar7 != (char *)0x0) {
        if (iVar16 == ctx->depth_) {
          psVar9 = (string *)0x0;
        }
        else {
          psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((long)iVar16,(long)ctx->depth_,"old_depth == depth_");
        }
        if (psVar9 != (string *)0x0) {
          pcVar7 = *(char **)psVar9;
          uVar11 = *(undefined8 *)(psVar9 + 8);
          pcVar13 = 
          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
          ;
          uVar12 = 1099;
          goto LAB_0015934f;
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      uVar10 = iVar17 + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar10;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar10 >> 0x1f & uVar10);
        return pcVar7;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}